

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O0

bool __thiscall
SimplexTimer::reportSimplexInnerClock
          (SimplexTimer *this,HighsTimerClock *simplex_timer_clock,double tolerance_percent_report_)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> simplex_clock_list;
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *in_stack_fffffffffffffed8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee0;
  initializer_list<int> in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff30;
  HighsTimerClock *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  SimplexTimer *in_stack_ffffffffffffff50;
  
  memcpy(&stack0xfffffffffffffef8,&DAT_00887560,200);
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffef7;
  std::allocator<int>::allocator((allocator<int> *)0x783fd0);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8);
  std::allocator<int>::~allocator((allocator<int> *)0x783ffe);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar1 = reportSimplexClockList
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return bVar1;
}

Assistant:

bool reportSimplexInnerClock(const HighsTimerClock& simplex_timer_clock,
                               const double tolerance_percent_report_ = -1) {
    const std::vector<HighsInt> simplex_clock_list{
        initialiseSimplexLpBasisAndFactorClock,
        allocateSimplexArraysClock,
        initialiseSimplexCostBoundsClock,
        setNonbasicMoveClock,
        DevexIzClock,
        DseIzClock,
        ComputeDualClock,
        CorrectDualClock,
        ComputePrimalClock,
        CollectPrIfsClock,
        ComputePrIfsClock,
        ComputeDuIfsClock,
        ComputeDuObjClock,
        ComputePrObjClock,
        InvertClock,
        ReportRebuildClock,
        PermWtClock,
        ChuzcPrimalClock,
        ChuzcHyperInitialiselClock,
        ChuzcHyperBasicFeasibilityChangeClock,
        ChuzcHyperDualClock,
        ChuzcHyperClock,
        Chuzc0Clock,
        Chuzc1Clock,
        Chuzc2Clock,
        Chuzc3Clock,
        Chuzc4Clock,
        Chuzc5Clock,
        FtranClock,
        ChuzrDualClock,
        Chuzr1Clock,
        Chuzr2Clock,
        BtranClock,
        PriceClock,
        BtranBasicFeasibilityChangeClock,
        PriceBasicFeasibilityChangeClock,
        UpdateDualBasicFeasibilityChangeClock,
        FtranBfrtClock,
        FtranDseClock,
        BtranPseClock,
        BtranFullClock,
        PriceFullClock,
        DevexWtClock,
        DevexUpdateWeightClock,
        DseUpdateWeightClock,
        UpdatePrimalClock,
        UpdateDualClock,
        UpdatePivotsClock,
        UpdateFactorClock,
        UpdateMatrixClock};
    return reportSimplexClockList("SimplexInner", simplex_clock_list,
                                  simplex_timer_clock,
                                  tolerance_percent_report_);
  }